

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

char * deqp::gles2::Functional::FboConfig::getFormatName(GLenum format)

{
  char *pcStack_10;
  GLenum format_local;
  
  if (format == 0x1906) {
    pcStack_10 = "alpha";
  }
  else if (format == 0x1907) {
    pcStack_10 = "rgb";
  }
  else if (format == 0x1908) {
    pcStack_10 = "rgba";
  }
  else if (format == 0x1909) {
    pcStack_10 = "luminance";
  }
  else if (format == 0x190a) {
    pcStack_10 = "luminance_alpha";
  }
  else if (format == 0x8056) {
    pcStack_10 = "rgba4";
  }
  else if (format == 0x8057) {
    pcStack_10 = "rgb5_a1";
  }
  else if (format == 0x81a5) {
    pcStack_10 = "depth_component16";
  }
  else if (format == 0x881a) {
    pcStack_10 = "rgba16f";
  }
  else if (format == 0x881b) {
    pcStack_10 = "rgb16f";
  }
  else if (format == 0x8d48) {
    pcStack_10 = "stencil_index8";
  }
  else if (format == 0x8d62) {
    pcStack_10 = "rgb565";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* FboConfig::getFormatName (GLenum format)
{
	switch (format)
	{
		case GL_RGB:				return "rgb";
		case GL_RGBA:				return "rgba";
		case GL_ALPHA:				return "alpha";
		case GL_LUMINANCE:			return "luminance";
		case GL_LUMINANCE_ALPHA:	return "luminance_alpha";
		case GL_RGB565:				return "rgb565";
		case GL_RGB5_A1:			return "rgb5_a1";
		case GL_RGBA4:				return "rgba4";
		case GL_RGBA16F:			return "rgba16f";
		case GL_RGB16F:				return "rgb16f";
		case GL_DEPTH_COMPONENT16:	return "depth_component16";
		case GL_STENCIL_INDEX8:		return "stencil_index8";
		default:					DE_ASSERT(false); return DE_NULL;
	}
}